

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

bool __thiscall cmCTestMultiProcessHandler::StartTest(cmCTestMultiProcessHandler *this,int test)

{
  mapped_type pcVar1;
  bool bVar2;
  mapped_type *ppcVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  int local_2c;
  
  local_2c = test;
  ppcVar3 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_2c);
  pcVar1 = *ppcVar3;
  for (p_Var5 = (pcVar1->LockedResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(pcVar1->LockedResources)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->LockedResources)._M_t,(key_type *)(p_Var5 + 1));
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(this->LockedResources)._M_t._M_impl.super__Rb_tree_header) goto LAB_001ace12;
  }
  pmVar6 = std::
           map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ::operator[](&(this->Tests).
                         super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                        ,&local_2c);
  if ((pmVar6->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
      super__Rb_tree_header._M_node_count == 0) {
    bVar2 = StartTestProcess(this,local_2c);
  }
  else {
LAB_001ace12:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmCTestMultiProcessHandler::StartTest(int test)
{
  // Check for locked resources
  for (std::string const& i : this->Properties[test]->LockedResources) {
    if (this->LockedResources.find(i) != this->LockedResources.end()) {
      return false;
    }
  }

  // if there are no depends left then run this test
  if (this->Tests[test].empty()) {
    return this->StartTestProcess(test);
  }
  // This test was not able to start because it is waiting
  // on depends to run
  return false;
}